

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O2

int runCVode(void *cvode_mem,N_Vector y,N_Vector *yS,UserData data)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long netfS;
  long ncfnS;
  long nniS;
  long nsetupsS;
  long nfeS;
  long nfSe;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype t;
  long nfeD;
  long njeD;
  
  printf("Sensitivity: ");
  if (*(int *)yS == 0) {
    pcVar3 = "NO";
  }
  else {
    printf("YES (");
    uVar1 = *(int *)((long)yS + 0xc) - 1;
    if (uVar1 < 3) {
      printf(&DAT_0010442c + *(int *)(&DAT_0010442c + (ulong)uVar1 * 4));
    }
    pcVar3 = "FULL ERROR CONTROL + ";
    if (*(int *)((long)yS + 4) == 0) {
      pcVar3 = "PARTIAL ERROR CONTROL + ";
    }
    printf(pcVar3);
    pcVar3 = "DQ sensitivity RHS)";
    if (*(int *)(yS + 1) == 0) {
      pcVar3 = "user-provided sensitivity RHS)";
    }
  }
  puts(pcVar3);
  printf("Parameters: [%8.4e  %8.4e  %8.4e]\n",yS[2],yS[3],yS[4]);
  iVar2 = CVode(0x4222a05f20000000,cvode_mem,y,&t,1);
  if (iVar2 == 0) {
    CVodeGetNumSteps(cvode_mem,&nst);
    CVodeGetNumRhsEvals(cvode_mem,&nfe);
    CVodeGetNumLinSolvSetups(cvode_mem,&nsetups);
    CVodeGetNumErrTestFails(cvode_mem,&netf);
    CVodeGetNumNonlinSolvIters(cvode_mem,&nni);
    CVodeGetNumNonlinSolvConvFails(cvode_mem,&ncfn);
    if (*(int *)yS != 0) {
      CVodeGetSensNumRhsEvals(cvode_mem,&nfSe);
      CVodeGetNumRhsEvalsSens(cvode_mem,&nfeS);
      CVodeGetSensNumLinSolvSetups(cvode_mem,&nsetupsS);
      if (*(int *)((long)yS + 4) == 0) {
        netfS = 0;
      }
      else {
        CVodeGetSensNumErrTestFails(cvode_mem,&netfS);
      }
      if (*(int *)((long)yS + 0xc) == 2) {
        CVodeGetSensNumNonlinSolvIters(cvode_mem,&nniS);
        CVodeGetSensNumNonlinSolvConvFails(cvode_mem,&ncfnS);
      }
      else {
        nniS = 0;
        ncfnS = 0;
      }
    }
    CVodeGetNumJacEvals(cvode_mem,&njeD);
    iVar2 = CVodeGetNumLinRhsEvals(cvode_mem,&nfeD);
    puts("Run statistics:");
    printf("   nst     = %5ld\n",nst);
    printf("   nfe     = %5ld\n",nfe);
    printf("   netf    = %5ld    nsetups  = %5ld\n",netf,nsetups);
    printf("   nni     = %5ld    ncfn     = %5ld\n",nni,ncfn);
    printf("   njeD    = %5ld    nfeD     = %5ld\n",njeD,nfeD);
    if (*(int *)yS != 0) {
      puts("   -----------------------------------");
      printf("   nfSe    = %5ld    nfeS     = %5ld\n",nfSe,nfeS);
      printf("   netfs   = %5ld    nsetupsS = %5ld\n",netfS,nsetupsS);
      printf("   nniS    = %5ld    ncfnS    = %5ld\n",nniS,ncfnS);
    }
    putchar(10);
  }
  return iVar2;
}

Assistant:

static int runCVode(void* cvode_mem, N_Vector y, N_Vector* yS, UserData data)
{
  sunrealtype t;
  int retval;

  /* Print header for current run */
  PrintHeader(data);

  /* Call CVode in CV_NORMAL mode */
  retval = CVode(cvode_mem, T1, y, &t, CV_NORMAL);
  if (retval != 0) { return (retval); }

  /* Print final statistics */
  retval = PrintFinalStats(cvode_mem, data);
  printf("\n");

  return (retval);
}